

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O2

void xercesc_4_0::XMLString::removeChar(XMLCh *srcString,XMLCh *toRemove,XMLBuffer *dstBuffer)

{
  XMLCh toAppend;
  
  if (srcString != (XMLCh *)0x0) {
    dstBuffer->fIndex = 0;
    while (toAppend = *srcString, toAppend != L'\0') {
      srcString = srcString + 1;
      if (toAppend != *toRemove) {
        XMLBuffer::append(dstBuffer,toAppend);
      }
    }
  }
  return;
}

Assistant:

void XMLString::removeChar(const XMLCh*     const srcString
                         , const XMLCh&           toRemove
                         ,       XMLBuffer&       dstBuffer)
{
    if(!srcString) return;
    const XMLCh* pszSrc = srcString;
    XMLCh c;

    dstBuffer.reset();

    while ((c=*pszSrc++)!=0)
    {
        if (c != toRemove)
            dstBuffer.append(c);
    }
}